

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O1

char * __thiscall Confparse::Parse(Confparse *this,char *key)

{
  char *pcVar1;
  byte bVar2;
  byte *__haystack;
  byte *pbVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  
  this->value[0] = '\0';
  __haystack = (byte *)this->conf;
  if (((key != (char *)0x0 && __haystack != (byte *)0x0) && (*__haystack != 0)) && (*key != '\0')) {
    sVar5 = strlen(key);
    if (((int)sVar5 != 0) &&
       (pbVar6 = (byte *)strstr((char *)__haystack,key), pbVar6 != (byte *)0x0)) {
      pcVar1 = this->value;
      pbVar3 = (byte *)this->limit;
      do {
        if (pbVar3 <= pbVar6) {
          return (char *)0x0;
        }
        pbVar7 = pbVar6 + (int)sVar5;
        if ((pbVar7 < pbVar3) && (iVar4 = isalnum((int)(char)*pbVar7), iVar4 == 0)) {
          do {
            if ((0x3d < (ulong)*pbVar7) ||
               ((0x2000000100000200U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) {
              if ((__haystack <= pbVar7) &&
                 (((pbVar6 == __haystack || (pbVar6[-1] == 0xd)) || (pbVar6[-1] == 10)))) {
                lVar8 = 0;
                goto LAB_0010cca4;
              }
              break;
            }
            pbVar7 = pbVar7 + 1;
          } while (pbVar7 < pbVar3);
        }
        pbVar6 = (byte *)strstr((char *)(pbVar6 + 1),key);
      } while (pbVar6 != (byte *)0x0);
    }
  }
  return (char *)0x0;
  while( true ) {
    bVar2 = pbVar7[lVar8];
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) goto LAB_0010ccd2;
    pcVar1[lVar8] = bVar2;
    lVar8 = lVar8 + 1;
    if (lVar8 == 0x2800) break;
LAB_0010cca4:
    if (this->limit <= pbVar7 + lVar8) goto LAB_0010ccd2;
  }
  lVar8 = 0x2800;
LAB_0010ccd2:
  pcVar1[lVar8] = '\0';
  return pcVar1;
}

Assistant:

char *Confparse::Parse(const char *key) {
	char *p, *op;
	char *llimit;
	int keylen;

	value[0] = '\0';

	if (!conf) return NULL;
	if (!key) return NULL;

	if (!conf[0]) return NULL;
	if (!key[0]) return NULL;

	keylen = strlen(key);
	if (keylen == 0) return NULL;

	p = strstr(conf, key);
	if (p == NULL) {
		return NULL;
	}

	op = p;

	llimit = limit; // - keylen - 2; // allows for up to 'key=x'

	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;

		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) p++; // get up to the start of the value;

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					size_t i = 0;

					/*
					 * Search for the end of the data by finding the end of the line
					 */
					while ((p < limit) && ((*p != '\0') && (*p != '\n') && (*p != '\r'))) {
						value[i] = *p;
						p++;
						i++;
						if (i >= CONFPARSE_MAX_VALUE_SIZE) break;
					}
					value[i] = '\0';
					return value;
				}
			}
		}

		// if the previous strstr() was a non-success, then try search again from the next bit
		if (op < limit) {
			p = strstr(op + 1, key);
			if (!p) break;
			op = p;
		} else {
			break;
		}
	}
	return NULL;
}